

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeBufferApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::framebuffer_texture(NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ContextType ctxType;
  GLuint fbo;
  GLuint texture [2];
  string local_48;
  GLuint local_24;
  GLuint local_20 [2];
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (bVar2) {
    local_24 = 0x1234;
    local_20[0] = 0x1234;
    local_20[1] = 0x1234;
    glu::CallLogWrapper::glGenFramebuffers(&ctx->super_CallLogWrapper,1,&local_24);
    glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,local_24);
    glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,2,local_20);
    glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,local_20[0]);
    glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8c2a,local_20[1]);
    NegativeTestContext::expectError(ctx,0);
    paVar1 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,
               "GL_INVALID_ENUM is generated if target is not one of the accepted tokens.","");
    NegativeTestContext::beginSection(ctx,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::glFramebufferTexture
              (&ctx->super_CallLogWrapper,0xffffffff,0x8ce0,local_20[0],0);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,
               "GL_INVALID_ENUM is generated if attachment is not one of the accepted tokens.","");
    NegativeTestContext::beginSection(ctx,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::glFramebufferTexture
              (&ctx->super_CallLogWrapper,0x8d40,0xffffffff,local_20[0],0);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,
               "GL_INVALID_OPERATION is generated if texture is neither 0 nor the name of an existing texture object."
               ,"");
    NegativeTestContext::beginSection(ctx,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::glFramebufferTexture(&ctx->super_CallLogWrapper,0x8d40,0x8ce0,0xffffffff,0)
    ;
    NegativeTestContext::expectError(ctx,0x501);
    NegativeTestContext::endSection(ctx);
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"GL_INVALID_OPERATION is generated if zero is bound to target.",
               "");
    NegativeTestContext::beginSection(ctx,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,0);
    glu::CallLogWrapper::glFramebufferTexture(&ctx->super_CallLogWrapper,0x8d40,0x8ce0,0,0);
    NegativeTestContext::expectError(ctx,0x502);
    glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,local_24);
    NegativeTestContext::endSection(ctx);
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,
               "GL_INVALID_OPERATION is generated by if texture is a buffer texture.","");
    NegativeTestContext::beginSection(ctx,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::glFramebufferTexture
              (&ctx->super_CallLogWrapper,0x8d40,0x8ce0,local_20[1],0);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    glu::CallLogWrapper::glDeleteFramebuffers(&ctx->super_CallLogWrapper,1,&local_24);
    glu::CallLogWrapper::glDeleteBuffers(&ctx->super_CallLogWrapper,2,local_20);
  }
  return;
}

Assistant:

void framebuffer_texture (NegativeTestContext& ctx)
{
	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)))
	{
		GLuint fbo = 0x1234;
		GLuint texture[] = {0x1234, 0x1234};

		ctx.glGenFramebuffers(1, &fbo);
		ctx.glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		ctx.glGenTextures(2, texture);
		ctx.glBindTexture(GL_TEXTURE_2D, texture[0]);
		ctx.glBindTexture(GL_TEXTURE_BUFFER, texture[1]);
		ctx.expectError(GL_NO_ERROR);

		ctx.beginSection("GL_INVALID_ENUM is generated if target is not one of the accepted tokens.");
		ctx.glFramebufferTexture(-1, GL_COLOR_ATTACHMENT0, texture[0], 0);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.endSection();

		ctx.beginSection("GL_INVALID_ENUM is generated if attachment is not one of the accepted tokens.");
		ctx.glFramebufferTexture(GL_FRAMEBUFFER, -1, texture[0], 0);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.endSection();

		ctx.beginSection("GL_INVALID_OPERATION is generated if texture is neither 0 nor the name of an existing texture object.");
		ctx.glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, -1, 0);
		ctx.expectError(GL_INVALID_VALUE);
		ctx.endSection();

		ctx.beginSection("GL_INVALID_OPERATION is generated if zero is bound to target.");
		ctx.glBindFramebuffer(GL_FRAMEBUFFER, 0);
		ctx.glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, 0, 0);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		ctx.endSection();

		ctx.beginSection("GL_INVALID_OPERATION is generated by if texture is a buffer texture.");
		ctx.glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, texture[1], 0);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.endSection();

		ctx.glDeleteFramebuffers(1, &fbo);
		ctx.glDeleteBuffers(2, texture);
	}
}